

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuSign(octet *sig,dstu_params *params,size_t ld,octet *hash,size_t hash_len,octet *privkey,
              gen_i rng,void *rng_state)

{
  bool_t bVar1;
  size_t sVar2;
  void *stack_00;
  ulong n;
  word *a;
  size_t sVar3;
  word *in_RCX;
  long lVar4;
  ulong in_RDX;
  void *in_RDI;
  word *in_R8;
  ec_o *in_R9;
  void *stack;
  word *s;
  word *r;
  word *y;
  word *x;
  word *h;
  word *e;
  ec_o *ec;
  size_t order_nb;
  size_t order_no;
  size_t order_n;
  err_t code;
  size_t in_stack_ffffffffffffff68;
  u64 *src;
  word *in_stack_ffffffffffffff70;
  u64 *dest;
  word *a_00;
  word *b;
  word *a_01;
  word *a_02;
  word *c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar5;
  
  c = (word *)0x0;
  if (s == (word *)0x0) {
    eVar5 = 0x130;
  }
  else {
    eVar5 = dstuEcCreate((ec_o **)s,(dstu_params *)stack,
                         (dstu_deep_i)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
    if (eVar5 == 0) {
      sVar2 = wwBitSize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      stack_00 = (void *)(sVar2 + 7 >> 3);
      n = sVar2 + 0x3f >> 6;
      bVar1 = memIsValid(in_R9,(size_t)stack_00);
      if ((((bVar1 == 0) || ((in_RDX & 0xf) != 0)) || (in_RDX < (ulong)((long)stack_00 << 4))) ||
         ((bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 == 0 ||
          (bVar1 = memIsValid(in_RDI,in_RDX + 7 >> 3), bVar1 == 0)))) {
        dstuEcClose((ec_o *)0x1655de);
        eVar5 = 0x6d;
      }
      else {
        a = (word *)((long)c + *c);
        a_02 = a + *(long *)(c[3] + 0x30);
        a_01 = a_02 + *(long *)(c[3] + 0x30);
        b = a_01 + *(long *)(c[3] + 0x30);
        a_00 = b + *(long *)(c[3] + 0x30);
        dest = a_00 + *(long *)(c[3] + 0x30);
        src = dest + *(long *)(c[3] + 0x30);
        if (in_R8 < *(word **)(c[3] + 0x38)) {
          memCopy(dest,src,0x1656db);
          memSet(dest,(octet)((ulong)src >> 0x38),0x1656fe);
        }
        else {
          memCopy(dest,src,0x16571c);
          sVar3 = gf2Deg((qr_o *)c[3]);
          lVar4 = *(long *)(c[3] + 0x38) + -1;
          *(byte *)((long)a_02 + lVar4) =
               *(byte *)((long)a_02 + lVar4) & (char)(1 << ((byte)sVar3 & 7)) - 1U;
        }
        (**(code **)(c[3] + 0x40))(a_02,a_02,c[3],src);
        bVar1 = wwIsZero(a_02,*(size_t *)(c[3] + 0x30));
        if (bVar1 != 0) {
          wwCopy(a_02,*(word **)(c[3] + 0x20),*(size_t *)(c[3] + 0x30));
        }
        do {
          do {
            do {
              do {
                (*(code *)s)(a,sVar2 + 7 >> 3,r);
                u64From(dest,src,0x165803);
                wwTrimHi(a,n,sVar2 - 1);
                bVar1 = wwIsZero(a,n);
              } while (bVar1 != 0);
              bVar1 = ecMulA(in_RCX,in_R8,in_R9,(word *)CONCAT44(eVar5,in_stack_ffffffffffffffc0),n,
                             stack_00);
              if (bVar1 == 0) {
                dstuEcClose((ec_o *)0x165868);
                return 0x1f6;
              }
              bVar1 = wwIsZero(a_01,*(size_t *)(c[3] + 0x30));
            } while (bVar1 != 0);
            (**(code **)(c[3] + 0x68))(b,a_01,a_02,c[3],src);
            (**(code **)(c[3] + 0x48))(a_00,b,c[3],src);
            u64From(dest,src,0x1658fe);
            wwTrimHi(a_00,n,sVar2 - 1);
            bVar1 = wwIsZero(a_00,n);
          } while (bVar1 != 0);
          u64From(dest,src,0x165943);
          zzMulMod(a_02,a_01,b,a_00,(size_t)dest,src);
          zzAddMod(c,a,a_02,a_01,(size_t)b);
          bVar1 = wwIsZero(dest,n);
        } while (bVar1 != 0);
        memSet(dest,(octet)((ulong)src >> 0x38),0x1659c0);
        u64To(dest,(size_t)src,(u64 *)0x1659d7);
        u64To(dest,(size_t)src,(u64 *)0x1659fa);
        dstuEcClose((ec_o *)0x165a04);
      }
    }
  }
  return eVar5;
}

Assistant:

err_t dstuSign(octet sig[], const dstu_params* params, size_t ld, 
	const octet hash[], size_t hash_len, const octet privkey[], 
	gen_i rng, void* rng_state)
{
	err_t code;
	size_t order_n, order_no, order_nb;
	// состояние
	ec_o* ec = 0;
	word* e;		/* эфемерный лк */
	word* h;		/* хэш-значение как элемент поля */
	word* x;		/* х-координата эфемерного ок */
	word* y;		/* y-координата эфемерного ок */
	word* r;		/* первая часть ЭЦП */
	word* s;		/* вторая часть ЭЦП */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	// шаги 1, 2: проверка params, privkey
	// шаг 3: проверить ld
	if (!memIsValid(privkey, order_no) || 
		ld % 16 != 0 || ld < 16 * order_no ||
		!memIsValid(hash, hash_len) ||
		!memIsValid(sig, O_OF_B(ld)))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	e = objEnd(ec, word);
	h = e + ec->f->n;
	x = h + ec->f->n;
	y = x + ec->f->n;
	r = y + ec->f->n;
	s = r + ec->f->n;
	stack = s + ec->f->n;
	// шаги 4 -- 6: хэширование
	// шаг 7: перевести hash в элемент основного поля h
	// [алгоритм из раздела 5.9 ДСТУ]
	if (hash_len < ec->f->no)
	{
		memCopy(h, hash, hash_len);
		memSetZero((octet*)h + hash_len, ec->f->no - hash_len);
	}
	else
	{
		memCopy(h, hash, ec->f->no);
		// memTrimHi(h, ec->f->no, gf2Deg(ec->f));
		((octet*)h)[ec->f->no - 1] &= (1 << gf2Deg(ec->f) % 8) - 1;
	}
	qrFrom(h, (octet*)h, ec->f, stack);
	// шаг 7: если h == 0, то h <- 1
	if (qrIsZero(h, ec->f))
		qrSetUnity(h, ec->f);
	// шаг 8: e <-R {1,2,..., order - 1}
	// [алгоритм из раздела 6.3 ДСТУ --- обрезка e]
step8:
	while (1)
	{
		rng(e, O_OF_B(order_nb), rng_state);
		wwFrom(e, e, O_OF_B(order_nb));
		wwTrimHi(e, order_n, order_nb - 1);
		ASSERT(wwCmp(e, ec->order, order_n) < 0);
		if (!wwIsZero(e, order_n))
			break;
	}
	// шаг 8: (x, y) <- e G
	if (!ecMulA(x, ec->base, ec, e, order_n, stack))
	{
		// если params корректны, то этого быть не должно
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// шаг 8: если x == 0, то повторить генерацию
	if (qrIsZero(x, ec->f))
		goto step8;
	// шаг 9: y <- x * h
	qrMul(y, x, h, ec->f, stack);
	// шаг 10: r <- \bar{y}
	ASSERT(order_n <= ec->f->n);
	qrTo((octet*)r, y, ec->f, stack);
	wwFrom(r, r, order_no);
	wwTrimHi(r, order_n, order_nb - 1);
	// шаг 11: если r = 0, то повторить генерацию
	if (wwIsZero(r, order_n))
		goto step8;
	// шаг 12: s <- (e + dr) mod order
	wwFrom(s, privkey, order_no);
	zzMulMod(s, s, r, ec->order, order_n, stack);
	zzAddMod(s, s, e, ec->order, order_n);
	// шаг 13: если s = 0, то повторить генерацию
	if (wwIsZero(s, order_n))
		goto step8;
	// шаг 14: сформировать ЭЦП из r и s
	// [алгоритм из раздела 5.10 ДСТУ]
	memSetZero(sig, O_OF_B(ld));
	wwTo(sig, order_no, r);
	wwTo(sig + ld / 16, order_no, s);
	// все нормально
	dstuEcClose(ec);
	return code;
}